

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_creader_set_buf(Curl_easy *data,char *buf,size_t blen)

{
  void *pvVar1;
  cr_buf_ctx *ctx;
  Curl_creader *r;
  size_t sStack_20;
  CURLcode result;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  sStack_20 = blen;
  blen_local = (size_t)buf;
  buf_local = (char *)data;
  r._4_4_ = Curl_creader_create((Curl_creader **)&ctx,data,&cr_buf,CURL_CR_CLIENT);
  if (r._4_4_ == CURLE_OK) {
    pvVar1 = (ctx->super).ctx;
    *(size_t *)((long)pvVar1 + 0x20) = blen_local;
    *(size_t *)((long)pvVar1 + 0x28) = sStack_20;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    cl_reset_reader((Curl_easy *)buf_local);
    r._4_4_ = do_init_reader_stack((Curl_easy *)buf_local,&ctx->super);
  }
  if ((((buf_local != (char *)0x0) && ((*(ulong *)(buf_local + 0xa9a) >> 0x1c & 1) != 0)) &&
      ((*(long *)(buf_local + 0x1328) == 0 || (0 < *(int *)(*(long *)(buf_local + 0x1328) + 8)))))
     && (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read((Curl_easy *)buf_local,"add buf reader, len=%zu -> %d",sStack_20,(ulong)r._4_4_);
  }
  return r._4_4_;
}

Assistant:

CURLcode Curl_creader_set_buf(struct Curl_easy *data,
                               const char *buf, size_t blen)
{
  CURLcode result;
  struct Curl_creader *r;
  struct cr_buf_ctx *ctx;

  result = Curl_creader_create(&r, data, &cr_buf, CURL_CR_CLIENT);
  if(result)
    goto out;
  ctx = r->ctx;
  ctx->buf = buf;
  ctx->blen = blen;
  ctx->index = 0;

  cl_reset_reader(data);
  result = do_init_reader_stack(data, r);
out:
  CURL_TRC_READ(data, "add buf reader, len=%zu -> %d", blen, result);
  return result;
}